

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O0

void do_shadow_cloak(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CHAR_DATA *in_RDI;
  int cost;
  int skill;
  AFFECT_DATA af;
  AFFECT_DATA *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  CHAR_DATA *in_stack_ffffffffffffff90;
  
  iVar2 = get_skill(ch,argument._4_4_);
  if (iVar2 == 0) {
    send_to_char((char *)in_stack_ffffffffffffff90,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  else {
    bVar1 = is_affected(in_RDI,(int)gsn_shadow_cloak);
    if (bVar1) {
      send_to_char((char *)in_stack_ffffffffffffff90,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    else {
      iVar3 = (int)skill_table[gsn_shadow_cloak].min_mana;
      if (in_RDI->mana - iVar3 < 0) {
        send_to_char((char *)in_stack_ffffffffffffff90,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      }
      else {
        iVar4 = number_percent();
        if (iVar4 < iVar2) {
          act((char *)in_stack_ffffffffffffff90,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
              (void *)CONCAT44(iVar2,iVar3),in_stack_ffffffffffffff78,0);
          init_affect((AFFECT_DATA *)0x760531);
          affect_to_char((CHAR_DATA *)CONCAT44(iVar2,iVar3),in_stack_ffffffffffffff78);
          check_improve((CHAR_DATA *)af.end_fun,af.pulse_fun._4_4_,af.pulse_fun._3_1_,
                        af.tick_fun._4_4_);
        }
        else {
          act((char *)in_stack_ffffffffffffff90,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
              (void *)CONCAT44(iVar2,iVar3),in_stack_ffffffffffffff78,0);
          check_improve((CHAR_DATA *)af.end_fun,af.pulse_fun._4_4_,af.pulse_fun._3_1_,
                        af.tick_fun._4_4_);
        }
        WAIT_STATE(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      }
    }
  }
  return;
}

Assistant:

void do_shadow_cloak(CHAR_DATA *ch, char *argument)
{
	AFFECT_DATA af;
	int skill, cost;

	skill = get_skill(ch, gsn_shadow_cloak);

	if (skill == 0)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_shadow_cloak))
	{
		send_to_char("You are already cloaked!\n\r", ch);
		return;
	}

	cost = skill_table[gsn_shadow_cloak].min_mana;

	if ((ch->mana - cost) < 0)
	{
		send_to_char("You do not have the mana.\n\r", ch);
		return;
	}

	if (number_percent() < skill)
	{
		act("You sharpen your mind and attempt to shield yourself from scrying magic.", ch, 0, 0, TO_CHAR);

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_shadow_cloak;
		af.level = ch->level;
		af.duration = ch->level / 2;
		af.aftype = AFT_SKILL;
		affect_to_char(ch, &af);
		check_improve(ch, gsn_shadow_cloak, true, 1);
	}
	else
	{
		act("You sharpen your mind and attempt to shield yourself from scrying magic, but you fail.", ch, 0, 0, TO_CHAR);
		check_improve(ch, gsn_shadow_cloak, false, 1);
	}

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}